

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

int qstrnicmp(char *str1,qsizetype len1,char *str2,qsizetype len2)

{
  int iVar1;
  uint uVar2;
  qsizetype qVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  if (str1 == (char *)0x0 || len1 == 0) {
    iVar1 = 0;
    if (len2 != 0) {
      if (len2 == -1) {
        if (str2 != (char *)0x0) {
          return -(uint)(*str2 != '\0');
        }
      }
      else {
        iVar1 = -1;
      }
    }
    return iVar1;
  }
  if (str2 == (char *)0x0) {
    return 1;
  }
  if (len2 == -1) {
    if (len1 < 1) {
      len1 = 0;
    }
    else {
      lVar4 = 0;
      do {
        uVar5 = (uint)str2[lVar4];
        if (str2[lVar4] == '\0') {
          return 1;
        }
        uVar6 = (uint)str1[lVar4];
        uVar2 = uVar6 + 0x20 & 0xff;
        if (0x19 < uVar6 - 0x41) {
          uVar2 = uVar6;
        }
        uVar6 = uVar5 + 0x20 & 0xff;
        if (0x19 < uVar5 - 0x41) {
          uVar6 = uVar5;
        }
        iVar1 = (uVar2 & 0xff) - (uVar6 & 0xff);
        if (iVar1 != 0) {
          return iVar1;
        }
        lVar4 = lVar4 + 1;
      } while (len1 != lVar4);
    }
    iVar1 = -(uint)(str2[len1] != '\0');
  }
  else {
    qVar3 = len2;
    if (len1 < len2) {
      qVar3 = len1;
    }
    if (0 < qVar3) {
      lVar4 = 0;
      do {
        uVar6 = (uint)str1[lVar4];
        uVar2 = (uint)str2[lVar4];
        uVar5 = uVar6 + 0x20 & 0xff;
        if (0x19 < uVar6 - 0x41) {
          uVar5 = uVar6;
        }
        uVar6 = uVar2 + 0x20 & 0xff;
        if (0x19 < uVar2 - 0x41) {
          uVar6 = uVar2;
        }
        iVar1 = (uVar5 & 0xff) - (uVar6 & 0xff);
        if (iVar1 != 0) {
          return iVar1;
        }
        lVar4 = lVar4 + 1;
      } while (qVar3 != lVar4);
    }
    iVar1 = ((len2 <= len1) - 1) + (uint)(len2 <= len1);
    if (len1 == len2) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int qstrnicmp(const char *str1, qsizetype len1, const char *str2, qsizetype len2)
{
    Q_ASSERT(len1 >= 0);
    Q_ASSERT(len2 >= -1);
    const uchar *s1 = reinterpret_cast<const uchar *>(str1);
    const uchar *s2 = reinterpret_cast<const uchar *>(str2);
    if (!s1 || !len1) {
        if (len2 == 0)
            return 0;
        if (len2 == -1)
            return (!s2 || !*s2) ? 0 : -1;
        Q_ASSERT(s2);
        return -1;
    }
    if (!s2)
        return len1 == 0 ? 0 : 1;

    if (len2 == -1) {
        // null-terminated str2
        qsizetype i;
        for (i = 0; i < len1; ++i) {
            const uchar c = s2[i];
            if (!c)
                return 1;

            if (int res = QtMiscUtils::caseCompareAscii(s1[i], c))
                return res;
        }
        return s2[i] ? -1 : 0;
    } else {
        // not null-terminated
        const qsizetype len = qMin(len1, len2);
        for (qsizetype i = 0; i < len; ++i) {
            if (int res = QtMiscUtils::caseCompareAscii(s1[i], s2[i]))
                return res;
        }
        if (len1 == len2)
            return 0;
        return len1 < len2 ? -1 : 1;
    }
}